

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O2

void __thiscall Memory::Recycler::ScanMemory<false>(Recycler *this,void **obj,size_t byteCount)

{
  if (byteCount != 0) {
    ScanMemoryInline<false,false>(this,obj,byteCount);
    return;
  }
  return;
}

Assistant:

void ScanMemory(void ** obj, size_t byteCount) { if (byteCount != 0) { ScanMemoryInline<doSpecialMark>(obj, byteCount); } }